

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQUnsignedInteger sq_getrefcount(HSQUIRRELVM v,HSQOBJECT *po)

{
  SQUnsignedInteger SVar1;
  
  if ((po->_type & 0x8000000) == 0) {
    return 0;
  }
  SVar1 = RefTable::GetRefCount(&v->_sharedstate->_refs_table,po);
  return SVar1;
}

Assistant:

SQUnsignedInteger sq_getrefcount(HSQUIRRELVM v,HSQOBJECT *po)
{
    if(!ISREFCOUNTED(sq_type(*po))) return 0;
#ifdef NO_GARBAGE_COLLECTOR
   return po->_unVal.pRefCounted->_uiRef;
#else
   return _ss(v)->_refs_table.GetRefCount(*po);
#endif
}